

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::UnloadAllDocuments(Context *this)

{
  int iVar1;
  pointer pEVar2;
  Element *this_00;
  ElementDocument *_document;
  Context *this_local;
  
  while( true ) {
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    iVar1 = Element::GetNumChildren(pEVar2,true);
    if (iVar1 < 1) break;
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    this_00 = Element::GetChild(pEVar2,0);
    _document = Element::GetOwnerDocument(this_00);
    UnloadDocument(this,_document);
  }
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::clear(&this->active_chain);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::clear(&this->hover_chain);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::clear(&this->drag_hover_chain);
  return;
}

Assistant:

void Context::UnloadAllDocuments()
{
	// Unload all children.
	while (root->GetNumChildren(true) > 0)
		UnloadDocument(root->GetChild(0)->GetOwnerDocument());

	// The element lists may point to elements that are getting removed.
	active_chain.clear();
	hover_chain.clear();
	drag_hover_chain.clear();
}